

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O1

FT_Int ps_tofixedarray(FT_Byte **acur,FT_Byte *limit,FT_Int max_values,FT_Fixed *values,
                      FT_Int power_ten)

{
  bool bVar1;
  bool bVar2;
  ulong uVar3;
  FT_Fixed FVar4;
  uint uVar5;
  FT_Int FVar6;
  FT_Byte *cur_1;
  byte *pbVar7;
  FT_Byte *cur;
  byte *local_50;
  uint local_48;
  FT_Int local_44;
  FT_Long local_40;
  FT_Byte **local_38;
  
  local_50 = *acur;
  FVar6 = 0;
  if (local_50 < limit) {
    if (*local_50 == 0x5b) {
      bVar1 = false;
      uVar5 = 0x5d;
    }
    else if (*local_50 == 0x7b) {
      uVar5 = 0x7d;
      bVar1 = false;
    }
    else {
      uVar5 = 0;
      bVar1 = true;
    }
    if (!bVar1) {
      local_50 = local_50 + 1;
    }
    local_40 = (FT_Long)power_ten;
    FVar6 = 0;
    local_48 = uVar5;
    local_44 = max_values;
    local_38 = acur;
    do {
      if (limit <= local_50) break;
      do {
        uVar3 = (ulong)*local_50;
        pbVar7 = local_50;
        if (0x25 < uVar3) break;
        if ((0x100003601U >> (uVar3 & 0x3f) & 1) == 0) {
          if (uVar3 != 0x25) break;
          do {
            pbVar7 = local_50;
            if ((*local_50 == 10) || (*local_50 == 0xd)) break;
            local_50 = local_50 + 1;
            pbVar7 = limit;
          } while (local_50 != limit);
        }
        local_50 = pbVar7 + 1;
        pbVar7 = local_50;
      } while (local_50 < limit);
      local_50 = pbVar7;
      if (pbVar7 < limit) {
        if (uVar5 == *pbVar7) {
          local_50 = pbVar7 + 1;
          goto LAB_00235319;
        }
        if ((values != (FT_Fixed *)0x0) && (max_values <= FVar6)) goto LAB_00235319;
        FVar4 = PS_Conv_ToFixed(&local_50,limit,local_40);
        if (values != (FT_Fixed *)0x0) {
          values[FVar6] = FVar4;
        }
        FVar6 = FVar6 + 1;
        if (pbVar7 == local_50) {
          FVar6 = -1;
        }
        bVar2 = (bool)(pbVar7 != local_50 & (bVar1 ^ 1U));
        acur = local_38;
        uVar5 = local_48;
        max_values = local_44;
      }
      else {
LAB_00235319:
        bVar2 = false;
      }
    } while (bVar2);
  }
  *acur = local_50;
  return FVar6;
}

Assistant:

static FT_Int
  ps_tofixedarray( FT_Byte*  *acur,
                   FT_Byte*   limit,
                   FT_Int     max_values,
                   FT_Fixed*  values,
                   FT_Int     power_ten )
  {
    FT_Byte*  cur   = *acur;
    FT_Int    count = 0;
    FT_Byte   c, ender;


    if ( cur >= limit )
      goto Exit;

    /* Check for the beginning of an array.  Otherwise, only one number */
    /* will be read.                                                    */
    c     = *cur;
    ender = 0;

    if ( c == '[' )
      ender = ']';
    else if ( c == '{' )
      ender = '}';

    if ( ender )
      cur++;

    /* now, read the values */
    while ( cur < limit )
    {
      FT_Fixed  dummy;
      FT_Byte*  old_cur;


      /* skip whitespace in front of data */
      skip_spaces( &cur, limit );
      if ( cur >= limit )
        goto Exit;

      if ( *cur == ender )
      {
        cur++;
        break;
      }

      old_cur = cur;

      if ( values && count >= max_values )
        break;

      /* call PS_Conv_ToFixed() even if coords == NULL */
      /* to properly parse number at `cur'             */
      *( values ? &values[count] : &dummy ) =
        PS_Conv_ToFixed( &cur, limit, power_ten );

      if ( old_cur == cur )
      {
        count = -1;
        goto Exit;
      }
      else
        count++;

      if ( !ender )
        break;
    }

  Exit:
    *acur = cur;
    return count;
  }